

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsLifetimeTests.hpp
# Opt level: O0

void __thiscall
deqp::gls::LifetimeTests::details::SimpleBinder::SimpleBinder
          (SimpleBinder *this,Context *ctx,BindFunc bindFunc,GLenum bindTarget,GLenum bindingParam,
          bool genRequired_)

{
  undefined4 in_register_0000000c;
  undefined3 in_register_00000089;
  byte in_stack_00000008;
  bool genRequired__local;
  GLenum bindingParam_local;
  GLenum bindTarget_local;
  BindFunc bindFunc_local;
  Context *ctx_local;
  SimpleBinder *this_local;
  
  Binder::Binder(&this->super_Binder,ctx);
  (this->super_Binder)._vptr_Binder = (_func_int **)&PTR__SimpleBinder_032d5260;
  *(ulong *)&this->field_0x38 = CONCAT44(in_register_0000000c,bindTarget);
  this->m_bindFunc = bindFunc;
  this->m_bindTarget = bindingParam;
  this->m_bindingParam = CONCAT31(in_register_00000089,genRequired_);
  this->m_genRequired = (bool)(in_stack_00000008 & 1);
  return;
}

Assistant:

SimpleBinder	(const Context& ctx,
										 BindFunc bindFunc,
										 GLenum bindTarget,
										 GLenum bindingParam,
										 bool genRequired_ = false)
							: Binder			(ctx)
							, m_bindFunc		(bindFunc)
							, m_bindTarget		(bindTarget)
							, m_bindingParam	(bindingParam)
							, m_genRequired		(genRequired_) {}